

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdOutput.h
# Opt level: O0

void __thiscall TCLAP::StdOutput::_shortUsage(StdOutput *this,CmdLineInterface *_cmd,ostream *os)

{
  Arg *pAVar1;
  bool bVar2;
  list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *__x;
  string *psVar3;
  XorHandler *pXVar4;
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  *__x_00;
  ulong uVar5;
  size_type sVar6;
  reference pvVar7;
  reference ppAVar8;
  undefined1 *puVar9;
  reference ppAVar10;
  int local_1dc;
  int secondLineOffset;
  allocator local_1c9;
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  iterator local_168;
  _List_const_iterator<TCLAP::Arg_*> local_160;
  iterator local_158;
  _List_const_iterator<TCLAP::Arg_*> local_150;
  ArgListIterator it_1;
  allocator local_139;
  string local_138 [32];
  string local_118 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8 [32];
  __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
  local_d8;
  __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
  local_d0;
  __normal_iterator<TCLAP::Arg_*const_*,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
  local_c8;
  ArgVectorIterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [4];
  int i;
  string s;
  undefined1 local_98 [8];
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  xorList;
  XorHandler xorHandler;
  string local_58 [8];
  string progName;
  undefined1 local_38 [8];
  list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> argList;
  ostream *os_local;
  CmdLineInterface *_cmd_local;
  StdOutput *this_local;
  
  argList.super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl._M_node._M_size =
       (size_t)os;
  __x = (list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)(**(code **)(*(long *)_cmd + 0x58))();
  std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::list
            ((list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)local_38,__x);
  psVar3 = (string *)(**(code **)(*(long *)_cmd + 0x50))();
  std::__cxx11::string::string(local_58,psVar3);
  pXVar4 = (XorHandler *)(**(code **)(*(long *)_cmd + 0x60))();
  XorHandler::XorHandler
            ((XorHandler *)
             &xorList.
              super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,pXVar4);
  __x_00 = XorHandler::getXorList
                     ((XorHandler *)
                      &xorList.
                       super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ::vector((vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
            *)local_98,__x_00);
  std::operator+(local_b8,(char *)local_58);
  it._M_current._4_4_ = 0;
  while( true ) {
    uVar5 = (ulong)it._M_current._4_4_;
    sVar6 = std::
            vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
            ::size((vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                    *)local_98);
    if (sVar6 <= uVar5) break;
    std::__cxx11::string::operator+=((string *)local_b8," {");
    pvVar7 = std::
             vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
             ::operator[]((vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                           *)local_98,(long)(int)it._M_current._4_4_);
    local_d0._M_current =
         (Arg **)std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::begin(pvVar7);
    __gnu_cxx::
    __normal_iterator<TCLAP::Arg*const*,std::vector<TCLAP::Arg*,std::allocator<TCLAP::Arg*>>>::
    __normal_iterator<TCLAP::Arg**>
              ((__normal_iterator<TCLAP::Arg*const*,std::vector<TCLAP::Arg*,std::allocator<TCLAP::Arg*>>>
                *)&local_c8,&local_d0);
    while( true ) {
      pvVar7 = std::
               vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
               ::operator[]((vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                             *)local_98,(long)(int)it._M_current._4_4_);
      local_d8._M_current =
           (Arg **)std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::end(pvVar7);
      bVar2 = __gnu_cxx::operator!=(&local_c8,&local_d8);
      if (!bVar2) break;
      ppAVar8 = __gnu_cxx::
                __normal_iterator<TCLAP::Arg_*const_*,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                ::operator*(&local_c8);
      pAVar1 = *ppAVar8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_138,"val",&local_139);
      (*pAVar1->_vptr_Arg[8])(local_118,pAVar1,local_138);
      std::operator+(local_f8,(char *)local_118);
      std::__cxx11::string::operator+=((string *)local_b8,(string *)local_f8);
      std::__cxx11::string::~string((string *)local_f8);
      std::__cxx11::string::~string(local_118);
      std::__cxx11::string::~string(local_138);
      std::allocator<char>::~allocator((allocator<char> *)&local_139);
      it_1._M_node = (_List_node_base *)
                     __gnu_cxx::
                     __normal_iterator<TCLAP::Arg_*const_*,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                     ::operator++(&local_c8,0);
    }
    std::__cxx11::string::length();
    puVar9 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_b8);
    *puVar9 = 0x7d;
    it._M_current._4_4_ = it._M_current._4_4_ + 1;
  }
  local_158._M_node =
       (_List_node_base *)
       std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::begin
                 ((list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)local_38);
  std::_List_const_iterator<TCLAP::Arg_*>::_List_const_iterator(&local_150,&local_158);
  while( true ) {
    local_168._M_node =
         (_List_node_base *)
         std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::end
                   ((list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)local_38);
    std::_List_const_iterator<TCLAP::Arg_*>::_List_const_iterator(&local_160,&local_168);
    bVar2 = std::operator!=(&local_150,&local_160);
    if (!bVar2) break;
    ppAVar10 = std::_List_const_iterator<TCLAP::Arg_*>::operator*(&local_150);
    bVar2 = XorHandler::contains
                      ((XorHandler *)
                       &xorList.
                        super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,*ppAVar10);
    if (!bVar2) {
      ppAVar10 = std::_List_const_iterator<TCLAP::Arg_*>::operator*(&local_150);
      pAVar1 = *ppAVar10;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1c8,"val",&local_1c9);
      (*pAVar1->_vptr_Arg[8])(local_1a8,pAVar1,local_1c8);
      std::operator+((char *)local_188,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10f134);
      std::__cxx11::string::operator+=((string *)local_b8,local_188);
      std::__cxx11::string::~string(local_188);
      std::__cxx11::string::~string(local_1a8);
      std::__cxx11::string::~string(local_1c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
    }
    std::_List_const_iterator<TCLAP::Arg_*>::operator++(&local_150,0);
  }
  local_1dc = std::__cxx11::string::length();
  local_1dc = local_1dc + 2;
  if (0x25 < local_1dc) {
    local_1dc = 0x25;
  }
  spacePrint(this,(ostream *)
                  argList.super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl.
                  _M_node._M_size,local_b8,0x4b,3,local_1dc);
  std::__cxx11::string::~string((string *)local_b8);
  std::
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ::~vector((vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
             *)local_98);
  XorHandler::~XorHandler
            ((XorHandler *)
             &xorList.
              super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::~list
            ((list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)local_38);
  return;
}

Assistant:

inline void 
StdOutput::_shortUsage( CmdLineInterface& _cmd, 
						std::ostream& os ) const
{
	std::list<Arg*> argList = _cmd.getArgList();
	std::string progName = _cmd.getProgramName();
	XorHandler xorHandler = _cmd.getXorHandler();
	std::vector< std::vector<Arg*> > xorList = xorHandler.getXorList();

	std::string s = progName + " ";

	// first the xor
	for ( int i = 0; static_cast<unsigned int>(i) < xorList.size(); i++ )
		{
			s += " {";
			for ( ArgVectorIterator it = xorList[i].begin(); 
				  it != xorList[i].end(); it++ )
				s += (*it)->shortID() + "|";

			s[s.length()-1] = '}';
		}

	// then the rest
	for (ArgListIterator it = argList.begin(); it != argList.end(); it++)
		if ( !xorHandler.contains( (*it) ) )
			s += " " + (*it)->shortID();

	// if the program name is too long, then adjust the second line offset 
	int secondLineOffset = static_cast<int>(progName.length()) + 2;
	if ( secondLineOffset > 75/2 )
		secondLineOffset = static_cast<int>(75/2);

	spacePrint( os, s, 75, 3, secondLineOffset );
}